

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

ON_SubDVertex * __thiscall
ON_SubDRTree::FindMarkedVertexAtPoint(ON_SubDRTree *this,ON_3dPoint P,double distance_tolerance)

{
  ON_3dPoint local_108;
  ON_3dPoint local_f0;
  undefined1 local_d8 [8];
  ON_3dVector rtol;
  ON_BoundingBox rbox;
  ON_SubDRTreeVertexFinder local_78;
  undefined1 local_48 [8];
  ON_SubDRTreeVertexFinder vf;
  double distance_tolerance_local;
  ON_SubDRTree *this_local;
  
  vf._40_8_ = distance_tolerance;
  ON_SubDRTreeVertexFinder::ON_SubDRTreeVertexFinder((ON_SubDRTreeVertexFinder *)local_48);
  rbox.m_max.z = P.x;
  ON_SubDRTreeVertexFinder::Create(&local_78,P,false);
  memcpy(local_48,&local_78,0x30);
  ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)&rtol.z);
  ON_3dVector::ON_3dVector
            ((ON_3dVector *)local_d8,(double)vf._40_8_,(double)vf._40_8_,(double)vf._40_8_);
  ON_3dPoint::operator-(&local_f0,(ON_3dPoint *)local_48,(ON_3dVector *)local_d8);
  rtol.z = local_f0.x;
  rbox.m_min.x = local_f0.y;
  rbox.m_min.y = local_f0.z;
  ON_3dPoint::operator+(&local_108,(ON_3dPoint *)local_48,(ON_3dVector *)local_d8);
  rbox.m_min.z = local_108.x;
  rbox.m_max.x = local_108.y;
  rbox.m_max.y = local_108.z;
  ON_RTree::Search((ON_RTree *)this,&rtol.z,&rbox.m_min.z,ON_SubDRTreeVertexFinder::Callback,
                   local_48);
  return (ON_SubDVertex *)vf.m_distance;
}

Assistant:

const ON_SubDVertex* ON_SubDRTree::FindMarkedVertexAtPoint(
  const ON_3dPoint P,
  const double distance_tolerance
) const
{
  ON_SubDRTreeVertexFinder vf;
  vf = ON_SubDRTreeVertexFinder::Create(P, false);

  ON_BoundingBox rbox;
  const ON_3dVector rtol(distance_tolerance, distance_tolerance, distance_tolerance);

  rbox.m_min = vf.m_P - rtol;
  rbox.m_max = vf.m_P + rtol;
  // vtree.Search() can return true (found nearby) and false (found exact) because 
  // ON_SubDRTreeVertexFinder::Callback() cancels the search when a vertex at the exact location
  // is found.
  this->Search(&rbox.m_min.x, &rbox.m_max.x, ON_SubDRTreeVertexFinder::Callback, &vf);
  return vf.m_v;
}